

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

EncodingResult<kj::String> * __thiscall
kj::decodeUtf16(EncodingResult<kj::String> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char16_t> utf16)

{
  char16_t *pcVar1;
  ushort uVar2;
  EncodingResult<kj::String> *pEVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  char16_t *pcVar8;
  ulong uVar9;
  char16_t *pcVar10;
  char16_t u;
  Vector<char> result;
  byte local_96;
  byte local_95;
  byte local_94;
  byte local_93;
  char16_t local_92;
  ulong local_90;
  Array<char> local_88;
  EncodingResult<kj::String> *local_70;
  ArrayBuilder<char> local_68;
  Array<char> local_48;
  
  pcVar8 = utf16.ptr;
  local_70 = __return_storage_ptr__;
  local_68.ptr = _::HeapArrayDisposer::allocateUninitialized<char>((long)pcVar8 + 1);
  local_68.endPtr = local_68.ptr + (long)pcVar8 + 1;
  local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_90 = 0;
  pcVar10 = (char16_t *)0x0;
  local_68.pos = local_68.ptr;
LAB_00273ef8:
  do {
    while( true ) {
      while( true ) {
        if (pcVar8 <= pcVar10) {
          local_88.ptr = (char *)((ulong)local_88.ptr & 0xffffffff00000000);
          Vector<char>::add<int>((Vector<char> *)&local_68,(int *)&local_88);
          Vector<char>::releaseAsArray(&local_48,(Vector<char> *)&local_68);
          sVar5 = local_48.size_;
          pcVar4 = local_48.ptr;
          pEVar3 = local_70;
          local_88.disposer = local_48.disposer;
          local_48.ptr = (char *)0x0;
          local_48.size_ = 0;
          (local_70->super_String).content.ptr = pcVar4;
          (local_70->super_String).content.size_ = sVar5;
          (local_70->super_String).content.disposer = local_48.disposer;
          local_88.ptr = (char *)0x0;
          local_88.size_ = 0;
          local_70->hadErrors = (bool)((byte)local_90 & 1);
          Array<char>::~Array(&local_88);
          Array<char>::~Array(&local_48);
          ArrayBuilder<char>::dispose(&local_68);
          return pEVar3;
        }
        pcVar1 = (char16_t *)((long)pcVar10 + 1);
        local_92 = *(char16_t *)(this + (long)pcVar10 * 2);
        if (0x7f < (ushort)local_92) break;
        Vector<char>::add<char16_t&>((Vector<char> *)&local_68,&local_92);
        pcVar10 = pcVar1;
      }
      if (0x7ff < (ushort)local_92) break;
      local_96 = (byte)((ushort)local_92 >> 6) | 0xc0;
      local_95 = (byte)local_92 & 0x3f | 0x80;
      local_88.ptr = (char *)&local_96;
      local_88.size_ = 2;
      Vector<char>::addAll<std::initializer_list<char>>
                ((Vector<char> *)&local_68,(initializer_list<char> *)&local_88);
      pcVar10 = pcVar1;
    }
    if ((local_92 & 0xf800U) == 0xd800) {
      uVar9 = CONCAT71((int7)((ulong)&local_92 >> 8),1);
      if ((pcVar1 != pcVar8) && ((local_92 & 0x400U) == 0)) {
        uVar2 = *(ushort *)(this + (long)pcVar10 * 2 + 2);
        if ((uVar2 & 0xfc00) == 0xdc00) {
          iVar6 = ((ushort)local_92 & 0x3ff) * 0x400;
          uVar7 = iVar6 + (uVar2 & 0x3ff) + 0x10000;
          local_96 = (byte)(uVar7 >> 0x12) | 0xf0;
          local_95 = (byte)(uVar7 >> 0xc) & 0x3f | 0x80;
          local_94 = (byte)(iVar6 + (uVar2 & 0x3ff) >> 6) & 0x3f | 0x80;
          local_93 = (byte)uVar2 & 0x3f | 0x80;
          local_88.ptr = (char *)&local_96;
          local_88.size_ = 4;
          Vector<char>::addAll<std::initializer_list<char>>
                    ((Vector<char> *)&local_68,(initializer_list<char> *)&local_88);
          pcVar10 = pcVar10 + 1;
          goto LAB_00273ef8;
        }
      }
    }
    else {
      uVar9 = local_90 & 0xffffffff;
    }
    local_96 = (byte)((ushort)local_92 >> 0xc) | 0xe0;
    local_95 = (byte)((ushort)local_92 >> 6) & 0x3f | 0x80;
    local_94 = (byte)local_92 & 0x3f | 0x80;
    local_88.ptr = (char *)&local_96;
    local_88.size_ = 3;
    Vector<char>::addAll<std::initializer_list<char>>
              ((Vector<char> *)&local_68,(initializer_list<char> *)&local_88);
    local_90 = uVar9 & 0xffffffff;
    pcVar10 = pcVar1;
  } while( true );
}

Assistant:

EncodingResult<String> decodeUtf16(ArrayPtr<const char16_t> utf16) {
  Vector<char> result(utf16.size() + 1);
  bool hadErrors = false;

  size_t i = 0;
  while (i < utf16.size()) {
    char16_t u = utf16[i++];

    if (u < 0x80) {
      result.add(u);
      continue;
    } else if (u < 0x0800) {
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >>  6)       ) | 0xc0),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else if ((u & 0xf800) == 0xd800) {
      // surrogate pair
      char16_t u2;
      if (KJ_UNLIKELY(i == utf16.size()                         // missing second half
                   || (u & 0x0400) != 0                         // first half in wrong range
                   || ((u2 = utf16[i]) & 0xfc00) != 0xdc00)) {  // second half in wrong range
        hadErrors = true;
        goto threeByte;
      }
      ++i;

      char32_t u32 = (((u & 0x03ff) << 10) | (u2 & 0x03ff)) + 0x10000;
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u32 >> 18)       ) | 0xf0),
        static_cast<char>(((u32 >> 12) & 0x3f) | 0x80),
        static_cast<char>(((u32 >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u32      ) & 0x3f) | 0x80)
      });
      continue;
    } else {
    threeByte:
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 12)       ) | 0xe0),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    }
  }

  result.add(0);
  return { String(result.releaseAsArray()), hadErrors };
}